

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# font_to_svg.hpp
# Opt level: O1

string * __thiscall
font2svg::glyph::svgheader_abi_cxx11_(string *__return_storage_ptr__,glyph *this)

{
  ostream *poVar1;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"");
  std::__cxx11::stringbuf::str((string *)&this->field_0x278);
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&this->field_0x270,"\n<svg width=\'",0xd);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)&this->field_0x270,this->bbwidth);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"px\'",3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," height=\'",9);
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->bbheight);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"px\'",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," xmlns=\'http://www.w3.org/2000/svg\' version=\'1.1\'>",0x32);
  std::__cxx11::stringbuf::str();
  return __return_storage_ptr__;
}

Assistant:

std::string svgheader() {
		tmp.str("");

		tmp << "\n<svg width='" << bbwidth << "px'"
			<< " height='" << bbheight << "px'"
			<< " xmlns='http://www.w3.org/2000/svg' version='1.1'>";

		return tmp.str();
	}